

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O1

void __thiscall
OpenMD::GCN::GCN(GCN *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType rCut,
                int bins)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  CoordinationNumber::CoordinationNumber
            (&this->super_CoordinationNumber,info,filename,sele1,sele2,rCut,bins);
  (this->super_CoordinationNumber).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__CoordinationNumber_0033a510;
  getPrefix(&local_38,filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  local_50 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_CoordinationNumber).super_StaticAnalyser.outputFilename_);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Generalized Coordination Number","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_CoordinationNumber).super_StaticAnalyser.analysisType_);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  return;
}

Assistant:

GCN::GCN(SimInfo* info, const std::string& filename, const std::string& sele1,
           const std::string& sele2, RealType rCut, int bins) :
      CoordinationNumber(info, filename, sele1, sele2, rCut, bins) {
    setOutputName(getPrefix(filename) + ".gcn");
    setAnalysisType("Generalized Coordination Number");
  }